

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::
parse_format_string<false,char,duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          *handler)

{
  ulong uVar1;
  buffer<char> *pbVar2;
  size_t sVar3;
  bool bVar4;
  internal iVar5;
  internal *piVar6;
  format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *this_00;
  buffer<char> *c;
  internal *end;
  pfs_writer write;
  id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&,_char>
  local_a0;
  pfs_writer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
             *)format_str.size_;
  end = (internal *)(format_str.data_ + (long)this);
  local_98.handler_ = this_00;
  do {
    if (this == end) {
      return;
    }
    piVar6 = this;
    if ((*this == (internal)0x7b) ||
       (piVar6 = (internal *)memchr(this,0x7b,(long)end - (long)this), piVar6 != (internal *)0x0)) {
      parse_format_string<false,_char,_duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&>
      ::pfs_writer::operator()(&local_98,(char *)this,(char *)piVar6);
      piVar6 = piVar6 + 1;
      if (piVar6 == end) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"invalid format string","");
        error_handler::on_error((error_handler *)this_00,&local_50);
      }
      if (*piVar6 == (internal)0x7b) {
        pbVar2 = (this_00->context).out_.container;
        sVar3 = pbVar2->size_;
        uVar1 = sVar3 + 1;
        if (pbVar2->capacity_ < uVar1) {
          (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
        }
        pbVar2->size_ = uVar1;
        *(internal *)(pbVar2->ptr_ + sVar3) = *piVar6;
        (this_00->context).out_.container = pbVar2;
      }
      else {
        if (*piVar6 == (internal)0x7d) {
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ::on_arg_id(this_00);
        }
        else {
          local_a0.handler = this_00;
          piVar6 = (internal *)
                   parse_arg_id<char,duckdb_fmt::v6::internal::id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>&,char>>
                             ((char *)piVar6,(char *)end,&local_a0);
          if (piVar6 == end) {
            iVar5 = (internal)0x0;
          }
          else {
            iVar5 = *piVar6;
          }
          if (iVar5 == (internal)0x3a) {
            piVar6 = (internal *)
                     format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                     ::on_format_specs(this_00,(char *)(piVar6 + 1),(char *)end);
            if ((piVar6 == end) || (*piVar6 != (internal)0x7d)) {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,"unknown format specifier","");
              error_handler::on_error((error_handler *)this_00,&local_70);
            }
            goto LAB_0029d489;
          }
          if (iVar5 != (internal)0x7d) {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"missing \'}\' in format string","");
            error_handler::on_error((error_handler *)this_00,&local_90);
          }
        }
        format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_replacement_field(this_00,(char *)piVar6);
      }
LAB_0029d489:
      this = piVar6 + 1;
      bVar4 = true;
    }
    else {
      parse_format_string<false,_char,_duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&>
      ::pfs_writer::operator()(&local_98,(char *)this,(char *)end);
      bVar4 = false;
    }
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct pfs_writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}